

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

difference_type __thiscall
Json::ValueIteratorBase::computeDistance(ValueIteratorBase *this,SelfType *other)

{
  bool bVar1;
  _Self local_30;
  iterator it;
  difference_type myDistance;
  SelfType *other_local;
  ValueIteratorBase *this_local;
  
  if (((this->isNull_ & 1U) == 0) || ((other->isNull_ & 1U) == 0)) {
    it._M_node._4_4_ = 0;
    local_30._M_node = (this->current_)._M_node;
    while( true ) {
      bVar1 = std::operator!=(&local_30,&other->current_);
      if (!bVar1) break;
      it._M_node._4_4_ = it._M_node._4_4_ + 1;
      std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator++
                (&local_30);
    }
    this_local._4_4_ = it._M_node._4_4_;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

ValueIteratorBase::difference_type
ValueIteratorBase::computeDistance(const SelfType& other) const {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
#ifdef JSON_USE_CPPTL_SMALLMAP
  return current_ - other.current_;
#else
  // Iterator for null value are initialized using the default
  // constructor, which initialize current_ to the default
  // std::map::iterator. As begin() and end() are two instance
  // of the default std::map::iterator, they can not be compared.
  // To allow this, we handle this comparison specifically.
  if (isNull_ && other.isNull_) {
    return 0;
  }

  // Usage of std::distance is not portable (does not compile with Sun Studio 12
  // RogueWave STL,
  // which is the one used by default).
  // Using a portable hand-made version for non random iterator instead:
  //   return difference_type( std::distance( current_, other.current_ ) );
  difference_type myDistance = 0;
  for (Value::ObjectValues::iterator it = current_; it != other.current_;
       ++it) {
    ++myDistance;
  }
  return myDistance;
#endif
#else
  if (isArray_)
    return ValueInternalArray::distance(iterator_.array_,
                                        other.iterator_.array_);
  return ValueInternalMap::distance(iterator_.map_, other.iterator_.map_);
#endif
}